

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

Gia_Man_t * Cec3_ManSimulateTest(Gia_Man_t *p,Cec_ParFra_t *pPars0)

{
  Gia_Man_t *pNew;
  Gia_Man_t *local_30;
  Cec3_Par_t local_28;
  
  local_30 = (Gia_Man_t *)0x0;
  local_28.nSimWords = 0xc;
  local_28.nSimRounds = 4;
  local_28.nItersMax = 10;
  local_28.fVeryVerbose = 0;
  local_28.nConfLimit = pPars0->nBTLimit;
  local_28._16_8_ = (ulong)(uint)pPars0->fUseCones << 0x20;
  local_28.fVerbose = pPars0->fVerbose;
  Cec3_ManPerformSweeping(p,&local_28,&local_30);
  return local_30;
}

Assistant:

Gia_Man_t * Cec3_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars0 )
{
    Gia_Man_t * pNew = NULL;
    //abctime clk = Abc_Clock();
    Cec3_Par_t Pars, * pPars = &Pars;
    Cec3_SetDefaultParams( pPars );
    // set resource limits
//    pPars->nSimWords  = pPars0->nWords;     // simulation words
//    pPars->nSimRounds = pPars0->nRounds;    // simulation rounds
//    pPars->nItersMax  = pPars0->nItersMax;  // max number of iterations
    pPars->nConfLimit = pPars0->nBTLimit;   // conflict limit at a node
    pPars->fUseCones  = pPars0->fUseCones;
    pPars->fVerbose   = pPars0->fVerbose;
//    Gia_ManComputeGiaEquivs( p, 100000, 0 );
//    Gia_ManEquivPrintClasses( p, 1, 0 );
    Cec3_ManPerformSweeping( p, pPars, &pNew );
    //Abc_PrintTime( 1, "SAT sweeping time", Abc_Clock() - clk );
    return pNew;
}